

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O2

int FindCollisions<unsigned_int>
              (vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes,
              HashSet<unsigned_int> *collisions,int maxCollisions)

{
  pointer puVar1;
  int iVar2;
  size_t hnb;
  ulong uVar3;
  long lVar4;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  iVar2 = 0;
  lVar4 = 4;
  for (uVar3 = 1;
      puVar1 = (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2);
      uVar3 = uVar3 + 1) {
    if (*(int *)((long)puVar1 + lVar4) == *(int *)((long)puVar1 + lVar4 + -4)) {
      iVar2 = iVar2 + 1;
      if ((int)(collisions->
               super_set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>)._M_t
               ._M_impl.super__Rb_tree_header._M_node_count < maxCollisions) {
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)collisions,(uint *)((long)puVar1 + lVar4));
      }
    }
    lVar4 = lVar4 + 4;
  }
  return iVar2;
}

Assistant:

int FindCollisions ( std::vector<hashtype> & hashes,
                     HashSet<hashtype> & collisions,
                     int maxCollisions )
{
  int collcount = 0;

  std::sort(hashes.begin(),hashes.end());

  for(size_t hnb = 1; hnb < hashes.size(); hnb++)
  {
    if(hashes[hnb] == hashes[hnb-1])
    {
      collcount++;

      if((int)collisions.size() < maxCollisions)
      {
        collisions.insert(hashes[hnb]);
      }
    }
  }

  return collcount;
}